

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::z_formatter<spdlog::details::scoped_padder>::format
          (z_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  byte bVar5;
  buffer<char> *buf;
  ulong uVar6;
  uint uVar7;
  string_view fmt;
  format_args args;
  scoped_padder p;
  scoped_padder local_60;
  uint local_38 [6];
  
  scoped_padder::scoped_padder(&local_60,6,&(this->super_flag_formatter).padinfo_,dest);
  lVar1 = (msg->time).__d.__r;
  if (lVar1 - (this->last_update_).__d.__r < 10000000000) {
    uVar7 = this->offset_minutes_;
  }
  else {
    auVar3 = SEXT816(tm_time->tm_gmtoff) * ZEXT816(0x8888888888888889);
    uVar7 = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
    this->offset_minutes_ = uVar7;
    (this->last_update_).__d.__r = lVar1;
  }
  sVar4 = (dest->super_buffer<char>).size_;
  uVar2 = (dest->super_buffer<char>).capacity_;
  uVar6 = sVar4 + 1;
  if ((int)uVar7 < 0) {
    if (uVar2 < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = '-';
    uVar7 = -uVar7;
  }
  else {
    if (uVar2 < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = '+';
  }
  if (uVar7 < 6000) {
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    bVar5 = (byte)((uVar7 / 0x3c & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = bVar5 | 0x30;
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = (char)((ulong)uVar7 / 0x3c) + bVar5 * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_38;
    args.desc_ = 1;
    local_38[0] = uVar7 / 0x3c;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  uVar6 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar4] = ':';
  sVar4 = (dest->super_buffer<char>).size_;
  uVar6 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
  }
  bVar5 = (byte)((uVar7 % 0x3c) / 10);
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar4] = bVar5 | 0x30;
  sVar4 = (dest->super_buffer<char>).size_;
  uVar6 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar4] = (char)(uVar7 % 0x3c) + bVar5 * -10 | 0x30;
  scoped_padder::~scoped_padder(&local_60);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative) {
            total_minutes = -total_minutes;
            dest.push_back('-');
        } else {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest);  // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest);  // minutes
    }